

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O0

void flatbuffers::tests::proto_test_union_suffix_id(string *proto_path,string *proto_file)

{
  undefined8 proto_file_00;
  bool expval;
  flatbuffers *this;
  string *in_RCX;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  string golden_file;
  undefined1 local_328 [8];
  IDLOptions opts;
  string *proto_file_local;
  string *proto_path_local;
  
  opts._776_8_ = proto_file;
  IDLOptions::IDLOptions((IDLOptions *)local_328);
  opts.indent_step._2_1_ = 0;
  opts.output_enum_identifiers = true;
  std::__cxx11::string::operator=((string *)&opts.cpp_static_reflection,"test_namespace_suffix");
  opts.prefixed_enums = true;
  opts.json_nested_flatbuffers = true;
  opts.python_version.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_358);
  std::operator+(&local_378,proto_path,"test_union_suffix_id.golden.fbs");
  this = (flatbuffers *)std::__cxx11::string::c_str();
  expval = LoadFile(this,(char *)0x0,SUB81(local_358,0),in_RCX);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile( (proto_path + \"test_union_suffix_id.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x94,"");
  std::__cxx11::string::~string((string *)&local_378);
  proto_file_00 = opts._776_8_;
  std::__cxx11::string::string((string *)&local_398);
  RunTest((IDLOptions *)local_328,proto_path,(string *)proto_file_00,(string *)local_358,&local_398)
  ;
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)local_358);
  IDLOptions::~IDLOptions((IDLOptions *)local_328);
  return;
}

Assistant:

void proto_test_union_suffix_id(const std::string &proto_path,
                                const std::string &proto_file) {
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = false;
  opts.proto_mode = true;
  opts.proto_namespace_suffix = "test_namespace_suffix";
  opts.proto_oneof_union = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  std::string golden_file;
  TEST_EQ(flatbuffers::LoadFile(
              (proto_path + "test_union_suffix_id.golden.fbs").c_str(), false,
              &golden_file),
          true);
  RunTest(opts, proto_path, proto_file, golden_file);
}